

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lcode.c
# Opt level: O1

void luaK_nil(FuncState *fs,int from,int n)

{
  int iVar1;
  int iVar2;
  uint uVar3;
  Instruction *pIVar4;
  bool bVar5;
  uint uVar6;
  int iVar7;
  long lVar8;
  
  lVar8 = (long)fs->pc;
  if (fs->lasttarget < fs->pc) {
    pIVar4 = fs->f->code;
    uVar3 = pIVar4[lVar8 + -1];
    if ((char)uVar3 == '\x04') {
      iVar1 = n + from;
      uVar6 = uVar3 >> 8 & 0x7f;
      if ((from <= (int)(uVar6 + 1 + (uVar3 >> 0x18)) && (int)uVar6 <= from) ||
         (bVar5 = true, (int)uVar6 <= iVar1 && from <= (int)uVar6)) {
        iVar2 = n + -1 + from;
        iVar7 = (uVar3 >> 0x18) + uVar6;
        if ((int)uVar6 < from) {
          from = uVar6;
        }
        if (iVar7 < iVar1) {
          iVar7 = iVar2;
        }
        *(byte *)((long)pIVar4 + lVar8 * 4 + -3) = (byte)from & 0x7f;
        if (((byte)ravi_parser_debug & 2) != 0) {
          raviY_printf(fs,"[%d]* %o ; set A to %d\n",(ulong)(fs->pc - 1),(ulong)pIVar4[lVar8 + -1]);
        }
        *(byte *)((long)pIVar4 + lVar8 * 4 + -1) = (char)iVar7 - (byte)from;
        if (((byte)ravi_parser_debug & 2) != 0) {
          raviY_printf(fs,"[%d]* %o ; set B to %d\n",(ulong)(fs->pc - 1),(ulong)pIVar4[lVar8 + -1]);
        }
        bVar5 = false;
      }
      if (!bVar5) {
        return;
      }
    }
  }
  luaK_codeABC(fs,OP_LOADNIL,from,n + -1,0);
  return;
}

Assistant:

void luaK_nil (FuncState *fs, int from, int n) {
  Instruction *previous;
  int l = from + n - 1;  /* last register to set nil */
  if (fs->pc > fs->lasttarget) {  /* no jumps to current position? */
    previous = &fs->f->code[fs->pc-1];
    if (GET_OPCODE(*previous) == OP_LOADNIL) {  /* previous is LOADNIL? */
      int pfrom = GETARG_A(*previous);  /* get previous range */
      int pl = pfrom + GETARG_B(*previous);
      if ((pfrom <= from && from <= pl + 1) ||
          (from <= pfrom && pfrom <= l + 1)) {  /* can connect both? */
        if (pfrom < from) from = pfrom;  /* from = min(from, pfrom) */
        if (pl > l) l = pl;  /* l = max(l, pl) */
        SETARG_A(*previous, from);
        DEBUG_CODEGEN(raviY_printf(fs, "[%d]* %o ; set A to %d\n", fs->pc - 1, *previous, from));
        SETARG_B(*previous, l - from);
        DEBUG_CODEGEN(raviY_printf(fs, "[%d]* %o ; set B to %d\n", fs->pc - 1, *previous, (l - from)));
        return;
      }
    }  /* else go through */
  }
  luaK_codeABC(fs, OP_LOADNIL, from, n - 1, 0);  /* else no optimization */
}